

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeyboardImpl.cpp
# Opt level: O0

Key sf::priv::KeyboardImpl::getKeyFromEvent(XKeyEvent *event)

{
  Key KVar1;
  KeySym symbol;
  undefined8 in_RDI;
  Key key;
  KeySym keysym;
  int i;
  int local_14;
  
  local_14 = 0;
  while( true ) {
    if (3 < local_14) {
      return Unknown;
    }
    symbol = XLookupKeysym(in_RDI,local_14);
    KVar1 = keySymToKey(symbol);
    if (KVar1 != Unknown) break;
    local_14 = local_14 + 1;
  }
  return KVar1;
}

Assistant:

Keyboard::Key KeyboardImpl::getKeyFromEvent(XKeyEvent& event)
{
    // Try each KeySym index (modifier group) until we get a match
    for (int i = 0; i < 4; ++i)
    {
        // Get the SFML keyboard code from the keysym of the key that has been pressed
        KeySym keysym = XLookupKeysym(&event, i);
        Keyboard::Key key = keySymToKey(keysym);
        if (key != Keyboard::Unknown)
            return key;
    }

    return Keyboard::Unknown;
}